

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isDupColumn(Index *pIdx,int nKey,Index *pPk,int iCol)

{
  short sVar1;
  int iVar2;
  int local_30;
  int j;
  int i;
  int iCol_local;
  Index *pPk_local;
  int nKey_local;
  Index *pIdx_local;
  
  sVar1 = pPk->aiColumn[iCol];
  local_30 = 0;
  while( true ) {
    if (nKey <= local_30) {
      return 0;
    }
    if ((pIdx->aiColumn[local_30] == sVar1) &&
       (iVar2 = sqlite3StrICmp(pIdx->azColl[local_30],pPk->azColl[iCol]), iVar2 == 0)) break;
    local_30 = local_30 + 1;
  }
  return 1;
}

Assistant:

static int isDupColumn(Index *pIdx, int nKey, Index *pPk, int iCol){
  int i, j;
  assert( nKey<=pIdx->nColumn );
  assert( iCol<MAX(pPk->nColumn,pPk->nKeyCol) );
  assert( pPk->idxType==SQLITE_IDXTYPE_PRIMARYKEY );
  assert( pPk->pTable->tabFlags & TF_WithoutRowid );
  assert( pPk->pTable==pIdx->pTable );
  testcase( pPk==pIdx );
  j = pPk->aiColumn[iCol];
  assert( j!=XN_ROWID && j!=XN_EXPR );
  for(i=0; i<nKey; i++){
    assert( pIdx->aiColumn[i]>=0 || j>=0 );
    if( pIdx->aiColumn[i]==j 
     && sqlite3StrICmp(pIdx->azColl[i], pPk->azColl[iCol])==0
    ){
      return 1;
    }
  }
  return 0;
}